

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseUserDefinedType(Parser *this,string *type_name)

{
  bool bVar1;
  Token *pTVar2;
  undefined1 local_98 [8];
  string identifier;
  allocator<char> local_61;
  string local_60;
  _Hashtable_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_false>
  local_40;
  undefined1 local_30 [8];
  const_iterator iter;
  string *type_name_local;
  Parser *this_local;
  
  iter.
  super__Hashtable_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_false>
  ._M_cur_bucket =
       (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_false>
        **)type_name;
  std::__cxx11::string::clear();
  pTVar2 = io::Tokenizer::current(this->input_);
  _local_30 = (_Hashtable_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_false>
               )std::tr1::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                        *)(anonymous_namespace)::kTypeNames_abi_cxx11_,&pTVar2->text);
  local_40 = (_Hashtable_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_false>
              )std::tr1::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
               ::end((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                      *)(anonymous_namespace)::kTypeNames_abi_cxx11_);
  bVar1 = std::tr1::__detail::operator!=
                    ((_Hashtable_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_false>
                      *)local_30,&local_40);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Expected message type.",&local_61);
    AddError(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    pTVar2 = io::Tokenizer::current(this->input_);
    std::__cxx11::string::operator=
              ((string *)
               iter.
               super__Hashtable_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_false>
               ._M_cur_bucket,(string *)&pTVar2->text);
    io::Tokenizer::Next(this->input_);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = TryConsume(this,".");
    if (bVar1) {
      std::__cxx11::string::append
                ((char *)iter.
                         super__Hashtable_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_false>
                         ._M_cur_bucket);
    }
    std::__cxx11::string::string((string *)local_98);
    bVar1 = ConsumeIdentifier(this,(string *)local_98,"Expected type name.");
    if (bVar1) {
      std::__cxx11::string::append
                ((string *)
                 iter.
                 super__Hashtable_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_false>
                 ._M_cur_bucket);
      while (bVar1 = TryConsume(this,"."), bVar1) {
        std::__cxx11::string::append
                  ((char *)iter.
                           super__Hashtable_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_false>
                           ._M_cur_bucket);
        bVar1 = ConsumeIdentifier(this,(string *)local_98,"Expected identifier.");
        if (!bVar1) {
          this_local._7_1_ = false;
          goto LAB_00358c3e;
        }
        std::__cxx11::string::append
                  ((string *)
                   iter.
                   super__Hashtable_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_false>
                   ._M_cur_bucket);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
LAB_00358c3e:
    std::__cxx11::string::~string((string *)local_98);
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseUserDefinedType(string* type_name) {
  type_name->clear();

  TypeNameMap::const_iterator iter = kTypeNames.find(input_->current().text);
  if (iter != kTypeNames.end()) {
    // Note:  The only place enum types are allowed is for field types, but
    //   if we are parsing a field type then we would not get here because
    //   primitives are allowed there as well.  So this error message doesn't
    //   need to account for enums.
    AddError("Expected message type.");

    // Pretend to accept this type so that we can go on parsing.
    *type_name = input_->current().text;
    input_->Next();
    return true;
  }

  // A leading "." means the name is fully-qualified.
  if (TryConsume(".")) type_name->append(".");

  // Consume the first part of the name.
  string identifier;
  DO(ConsumeIdentifier(&identifier, "Expected type name."));
  type_name->append(identifier);

  // Consume more parts.
  while (TryConsume(".")) {
    type_name->append(".");
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    type_name->append(identifier);
  }

  return true;
}